

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testUleb(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t size;
  byte bVar4;
  C *pCVar5;
  long lVar6;
  bool bVar7;
  char buffer [16];
  byte local_68 [24];
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  lVar6 = 0;
  do {
    uVar1 = testUleb::values[lVar6];
    size = 0;
    uVar3 = uVar1;
    do {
      bVar4 = (byte)uVar3 | 0x80;
      if (uVar3 < 0x80) {
        bVar4 = (byte)uVar3;
      }
      local_68[size] = bVar4;
      size = size + 1;
      bVar7 = 0x7f < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar7);
    axl::enc::HexEncoding::encode((String *)&local_50,local_68,size,0);
    pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_50.m_length != 0) {
      pCVar5 = local_50.m_p;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    printf("0x%llx (%d us, %d bps) -> %s\n",uVar1,uVar1,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000)) / auVar2,0),pCVar5);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
    bVar7 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar7);
  return;
}

Assistant:

void testUleb() {
	static uint64_t values[] = {
		0x13AF12,
		0x00270F,
	};

	char buffer[16];

	for (size_t i = 0; i < countof(values); i++) {
		uint64_t x = values[i];
		char* p = enc::encodeUleb128(buffer, x);
		printf("0x%llx (%d us, %d bps) -> %s\n", x, x, 1000000ULL * 10 / x, enc::HexEncoding::encode(buffer, p - buffer).sz());
	}
}